

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O1

void __thiscall Polymerase::Move(Polymerase *this)

{
  int *piVar1;
  int iVar2;
  SpeciesTracker *pSVar3;
  
  iVar2 = std::__cxx11::string::compare((char *)&(this->super_MobileElement).name_);
  if (iVar2 == 0) {
    pSVar3 = SpeciesTracker::Instance();
    iVar2 = 3;
    if ((pSVar3->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    goto LAB_00115805;
  }
  iVar2 = 1;
LAB_00115805:
  piVar1 = &(this->super_MobileElement).start_;
  *piVar1 = *piVar1 + iVar2;
  piVar1 = &(this->super_MobileElement).stop_;
  *piVar1 = *piVar1 + iVar2;
  return;
}

Assistant:

void Polymerase::Move() {

  if (name_ == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    start_ += 3;
    stop_ += 3;
  } else {
    start_++;
    stop_++;
  }
}